

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_namer.h
# Opt level: O0

string * __thiscall
flatbuffers::BfbsNamer::Denamespace<reflection::Object_const*>
          (string *__return_storage_ptr__,BfbsNamer *this,Object *t,string *namespace_prefix,
          char delimiter)

{
  String *this_00;
  char *__s;
  allocator<char> local_51;
  string local_50;
  char local_29;
  string *psStack_28;
  char delimiter_local;
  string *namespace_prefix_local;
  Object *t_local;
  BfbsNamer *this_local;
  
  local_29 = delimiter;
  psStack_28 = namespace_prefix;
  namespace_prefix_local = (string *)t;
  t_local = (Object *)this;
  this_local = (BfbsNamer *)__return_storage_ptr__;
  this_00 = reflection::Object::name(t);
  __s = String::c_str(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_51);
  Namer::Denamespace(__return_storage_ptr__,&this->super_Namer,&local_50,psStack_28,local_29);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  return __return_storage_ptr__;
}

Assistant:

std::string Denamespace(T t, std::string &namespace_prefix,
                          const char delimiter = '.') const {
    return Namer::Denamespace(t->name()->c_str(), namespace_prefix, delimiter);
  }